

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

shared_ptr<minja::Expression> __thiscall minja::Parser::parseBracedExpressionOrArray(Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char *pcVar3;
  char *pcVar4;
  size_type sVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  runtime_error *prVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  Parser *in_RSI;
  shared_ptr<minja::Expression> sVar9;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  tuple;
  shared_ptr<minja::Expression> next;
  string local_b8;
  string local_98;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  local_78;
  shared_ptr<minja::Expression> local_58;
  CharIterator local_48;
  CharIterator local_40;
  CharIterator local_38;
  
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"(","");
  consumeToken(&local_98,in_RSI,&local_b8,Strip);
  sVar5 = local_98._M_string_length;
  _Var8._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    _Var8._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    _Var8._M_pi = extraout_RDX_01;
  }
  if (sVar5 == 0) {
    local_58.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    local_58.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0;
    local_58.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _0_4_ = 0;
    local_58.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 0;
  }
  else {
    parseExpression((Parser *)&local_58,SUB81(in_RSI,0));
    if (CONCAT44(local_58.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                 _4_4_,local_58.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr._0_4_) == 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Expected expression in braced expression");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,")","");
    consumeToken(&local_98,in_RSI,&local_b8,Strip);
    sVar5 = local_98._M_string_length;
    _Var8._M_pi = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      _Var8._M_pi = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      _Var8._M_pi = extraout_RDX_04;
    }
    if (sVar5 == 0) {
      local_78.
      super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_38._M_current = (char *)this;
      std::
      vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
      ::emplace_back<std::shared_ptr<minja::Expression>>
                ((vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
                  *)&local_78,&local_58);
      if ((in_RSI->it)._M_current != (in_RSI->end)._M_current) {
        do {
          local_b8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,",","");
          consumeToken(&local_98,in_RSI,&local_b8,Strip);
          sVar5 = local_98._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (sVar5 == 0) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Expected comma in tuple");
            goto LAB_001e26ff;
          }
          parseExpression((Parser *)&local_48,SUB81(in_RSI,0));
          if (local_48._M_current == (char *)0x0) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar6,"Expected expression in tuple");
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::
          vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
          ::emplace_back<std::shared_ptr<minja::Expression>>
                    ((vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
                      *)&local_78,(shared_ptr<minja::Expression> *)&local_48);
          local_b8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,")","");
          consumeToken(&local_98,in_RSI,&local_b8,Strip);
          sVar5 = local_98._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          this = (Parser *)local_38._M_current;
          if (sVar5 != 0) {
            peVar2 = (in_RSI->template_str).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            this_00 = (in_RSI->template_str).
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            pcVar3 = (in_RSI->it)._M_current;
            pcVar4 = (in_RSI->start)._M_current;
            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
            p_Var7->_M_use_count = 1;
            p_Var7->_M_weak_count = 1;
            p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0025fb10;
            p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR___cxa_pure_virtual_0025f9f0;
            *(element_type **)&p_Var7[1]._M_use_count = peVar2;
            p_Var7[2]._vptr__Sp_counted_base = (_func_int **)this_00;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            *(long *)&p_Var7[2]._M_use_count = (long)pcVar3 - (long)pcVar4;
            p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR_do_evaluate_0025fb60;
            p_Var7[3]._vptr__Sp_counted_base =
                 (_func_int **)
                 local_78.
                 super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            *(pointer *)&p_Var7[3]._M_use_count =
                 local_78.
                 super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            p_Var7[4]._vptr__Sp_counted_base =
                 (_func_int **)
                 local_78.
                 super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_78.
            super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_78.
            super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_78.
            super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this = p_Var7 + 1;
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)this + 8))->_M_pi = p_Var7;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_current !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_current);
            }
            std::
            vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
            ::~vector(&local_78);
            _Var8._M_pi = extraout_RDX_05;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(local_58.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._4_4_,
                         local_58.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._0_4_) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(local_58.
                                  super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi._4_4_,
                                  local_58.
                                  super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi._0_4_));
              _Var8._M_pi = extraout_RDX_06;
            }
            goto LAB_001e2442;
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_current !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_current);
          }
        } while ((in_RSI->it)._M_current != (in_RSI->end)._M_current);
      }
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Expected closing parenthesis");
LAB_001e26ff:
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  *(undefined4 *)
   &(this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_58.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
              _0_4_;
  *(undefined4 *)
   ((long)&(this->template_str).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr + 4) =
       local_58.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_;
  *(undefined4 *)
   &(this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
       local_58.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _0_4_;
  *(undefined4 *)
   ((long)&(this->template_str).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi + 4) =
       local_58.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _4_4_;
LAB_001e2442:
  sVar9.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  sVar9.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<minja::Expression>)
         sVar9.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseBracedExpressionOrArray() {
        if (consumeToken("(").empty()) return nullptr;

        auto expr = parseExpression();
        if (!expr) throw std::runtime_error("Expected expression in braced expression");

        if (!consumeToken(")").empty()) {
            return expr;  // Drop the parentheses
        }

        std::vector<std::shared_ptr<Expression>> tuple;
        tuple.emplace_back(std::move(expr));

        while (it != end) {
          if (consumeToken(",").empty()) throw std::runtime_error("Expected comma in tuple");
          auto next = parseExpression();
          if (!next) throw std::runtime_error("Expected expression in tuple");
          tuple.push_back(std::move(next));

          if (!consumeToken(")").empty()) {
              return std::make_shared<ArrayExpr>(get_location(), std::move(tuple));
          }
        }
        throw std::runtime_error("Expected closing parenthesis");
    }